

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O3

uint32_t * __thiscall
FastPForLib::Simple16<true>::decodeArray
          (Simple16<true> *this,uint32_t *in,size_t param_2,uint32_t *out,size_t *nvalue)

{
  ulong uVar1;
  NotEnoughStorage *this_00;
  size_t extraout_RDX;
  uint *local_30;
  uint32_t *local_28;
  
  uVar1 = (ulong)*in;
  local_28 = out;
  if (*nvalue < uVar1) {
    this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(this_00,(ulong)*in);
    __cxa_throw(this_00,&NotEnoughStorage::typeinfo,std::runtime_error::~runtime_error);
  }
  local_30 = in + 1;
  *nvalue = uVar1;
  if (uVar1 != 0) {
    do {
      (**(code **)(unpackarray + (ulong)(*local_30 >> 0x1c) * 8))(&local_28,&local_30,param_2);
      param_2 = extraout_RDX;
    } while (local_28 < out + uVar1);
  }
  return local_30;
}

Assistant:

const uint32_t *Simple16<MarkLength>::decodeArray(const uint32_t *in,
#ifndef NDEBUG
                                                  const size_t len,
                                                  uint32_t *out,
                                                  size_t &nvalue) {
#else
                                                  const size_t, uint32_t *out,
                                                  size_t &nvalue) {
#endif
#ifndef NDEBUG
  const uint32_t *const endin = in + len;
#endif
  if (MarkLength)
    if ((*in) > nvalue)
      throw NotEnoughStorage(*in);
  const uint32_t actualvalue =
      MarkLength ? *(in++) : static_cast<uint32_t>(nvalue);
  if (nvalue < actualvalue)
    fprintf(stderr, "possible overrun\n");
  nvalue = actualvalue;
#ifdef STATS
  printf("simple16 decode %zu\n", len);
  std::vector<uint32_t> stats(16, 0);
#endif
  const uint32_t *const end = out + nvalue;
  while (end > out) {
#ifdef STATS
    stats[which(in)]++;
#endif
    (unpackarray[which(in)])(&out, &in);
  }

#ifdef STATS
  uint32_t sum = std::accumulate(stats.begin(), stats.end(), 0);
  for (uint32_t k = 0; k < stats.size(); ++k) {
    printf("simple16 stats[%u]=%f\n", k, stats[k] * 1.0 / sum);
  }
#endif
  ASSERT(in <= endin, std::to_string(in - endin));
  return in;
}